

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfThenElseEvaluationTest.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _func_int **pp_Var6;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  long *plVar10;
  ulong *puVar11;
  undefined8 *puVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  ulong uVar14;
  undefined8 uVar15;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Variable x;
  Variable y;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  Variable local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  _func_int **local_1a0;
  Expression local_198;
  long lStack_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  Variable local_158;
  Expression local_140;
  long lStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Expression local_c0;
  Expression local_a8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_218 = (undefined8 *)0x0;
  local_1f8._vptr_Variable = (_func_int **)&PTR_differentiate_00110c30;
  local_1f8.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_1f8.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_1f8.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_238,(double *)&local_218);
  local_218 = (undefined8 *)0x0;
  local_158._vptr_Variable = (_func_int **)&PTR_differentiate_00110c30;
  local_158.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_1a0 = (_func_int **)&PTR_differentiate_00110c30;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_158.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_158.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_238,(double *)&local_218);
  (local_1f8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_158.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       2.0;
  Kandinsky::operator><Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_c0,&local_1f8,&local_158);
  Kandinsky::ifThenElse<Kandinsky::Expression,_Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_a8,&local_c0,&local_1f8,&local_158);
  (**(local_a8.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_1f8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_50,vsnprintf,0x148,"%f");
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x10d020);
  p_Var3 = &local_140.m_baseExpressionPtr.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  plVar10 = plVar7 + 2;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar7 ==
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)plVar10) {
    local_140.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar10;
    lStack_128 = plVar7[3];
    local_140._vptr_Expression = (_func_int **)p_Var3;
  }
  else {
    local_140.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar10;
    local_140._vptr_Expression = (_func_int **)*plVar7;
  }
  local_140.m_baseExpressionPtr.
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  p_Var4 = &local_198.m_baseExpressionPtr.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar7 ==
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)puVar11) {
    local_198.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar11;
    lStack_180 = plVar7[3];
    local_198._vptr_Expression = (_func_int **)p_Var4;
  }
  else {
    local_198.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar11;
    local_198._vptr_Expression = (_func_int **)*plVar7;
  }
  local_198.m_baseExpressionPtr.
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (**((local_158.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_120,vsnprintf,0x148,"%f");
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(local_198.m_baseExpressionPtr.
                    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->_vptr_BaseExpression + local_120._M_string_length);
  _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_198._vptr_Expression != p_Var4) {
    _Var13._M_pi = local_198.m_baseExpressionPtr.
                   super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
  }
  if (_Var13._M_pi < p_Var1) {
    uVar15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_120._M_dataplus._M_p._4_4_,local_120._M_dataplus._M_p._0_4_) !=
        &local_120.field_2) {
      uVar15 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < p_Var1) goto LAB_001085b3;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_120,0,(char *)0x0,(ulong)local_198._vptr_Expression);
  }
  else {
LAB_001085b3:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_198,
                        (ulong)CONCAT44(local_120._M_dataplus._M_p._4_4_,
                                        local_120._M_dataplus._M_p._0_4_));
  }
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  puVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_1e0.field_2._M_allocated_capacity = *puVar11;
    local_1e0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *puVar11;
    local_1e0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_1e0._M_string_length = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  paVar5 = &local_178.field_2;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_178.field_2._M_allocated_capacity = *puVar11;
    local_178.field_2._8_8_ = plVar7[3];
    local_178._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_178.field_2._M_allocated_capacity = *puVar11;
    local_178._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_178._M_string_length = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (**((local_1f8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_e0,vsnprintf,0x148,"%f");
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar5) {
    uVar15 = local_178.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_e0._M_string_length + local_178._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar15 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_e0._M_string_length + local_178._M_string_length) goto LAB_00108707;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_e0,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
  }
  else {
LAB_00108707:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_e0._M_dataplus._M_p);
  }
  local_1c0 = &local_1b0;
  puVar12 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar12) {
    local_1b0 = *puVar12;
    uStack_1a8 = puVar8[3];
  }
  else {
    local_1b0 = *puVar12;
    local_1c0 = (undefined8 *)*puVar8;
  }
  local_1b8 = puVar8[1];
  *puVar8 = puVar12;
  puVar8[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_228 = *puVar11;
    lStack_220 = plVar7[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar11;
    local_238 = (ulong *)*plVar7;
  }
  local_230 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (**((local_158.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_100,vsnprintf,0x148,"%f");
  uVar14 = 0xf;
  if (local_238 != &local_228) {
    uVar14 = local_228;
  }
  if (uVar14 < local_100._M_string_length + local_230) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      uVar15 = local_100.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_100._M_string_length + local_230) goto LAB_00108858;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_238);
  }
  else {
LAB_00108858:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_100._M_dataplus._M_p);
  }
  local_218 = &local_208;
  puVar12 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar12) {
    local_208 = *puVar12;
    uStack_200 = puVar8[3];
  }
  else {
    local_208 = *puVar12;
    local_218 = (undefined8 *)*puVar8;
  }
  local_210 = puVar8[1];
  *puVar8 = puVar12;
  puVar8[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_218);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_60 = *plVar10;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar10;
    local_70 = (long *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((extraout_XMM0_Qa != 3.0) || (NAN(extraout_XMM0_Qa))) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_70,local_68);
    std::endl<char,std::char_traits<char>>(poVar9);
    goto LAB_00108e28;
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar5) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  paVar2 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_120._M_dataplus._M_p._4_4_,local_120._M_dataplus._M_p._0_4_) !=
      &local_120.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_120._M_dataplus._M_p._4_4_,local_120._M_dataplus._M_p._0_4_));
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_198._vptr_Expression != p_Var4) {
    operator_delete(local_198._vptr_Expression);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_140._vptr_Expression != p_Var3) {
    operator_delete(local_140._vptr_Expression);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_));
  }
  local_a8._vptr_Expression = (_func_int **)&PTR_variables_00110c58;
  if (local_a8.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_c0._vptr_Expression = (_func_int **)&PTR_variables_00110c58;
  if (local_c0.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_50._M_dataplus._M_p._0_4_ = 4;
  Kandinsky::operator><Kandinsky::Variable,_int,_nullptr>(&local_140,&local_1f8,(int *)&local_50);
  local_120._M_dataplus._M_p._0_4_ = 4;
  Kandinsky::ifThenElse<Kandinsky::Expression,_Kandinsky::Variable,_int,_nullptr>
            (&local_198,&local_140,&local_1f8,(int *)&local_120);
  (**(local_198.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_1f8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_178,vsnprintf,0x148,"%f");
  puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x10d020);
  puVar12 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar12) {
    local_1b0 = *puVar12;
    uStack_1a8 = puVar8[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *puVar12;
    local_1c0 = (undefined8 *)*puVar8;
  }
  local_1b8 = puVar8[1];
  *puVar8 = puVar12;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
  local_238 = &local_228;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_228 = *puVar11;
    lStack_220 = puVar8[3];
  }
  else {
    local_228 = *puVar11;
    local_238 = (ulong *)*puVar8;
  }
  local_230 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  (**((local_1f8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_1e0,vsnprintf,0x148,"%f");
  uVar14 = 0xf;
  if (local_238 != &local_228) {
    uVar14 = local_228;
  }
  if (uVar14 < local_1e0._M_string_length + local_230) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar2) {
      uVar15 = local_1e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_1e0._M_string_length + local_230) goto LAB_00108c23;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_238);
  }
  else {
LAB_00108c23:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1e0._M_dataplus._M_p);
  }
  puVar12 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar12) {
    local_208 = *puVar12;
    uStack_200 = puVar8[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar12;
    local_218 = (undefined8 *)*puVar8;
  }
  local_210 = puVar8[1];
  *puVar8 = puVar12;
  puVar8[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_218);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_80 = *plVar10;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar10;
    local_90 = (long *)*plVar7;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((extraout_XMM0_Qa_00 == 4.0) && (!NAN(extraout_XMM0_Qa_00))) {
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
    pp_Var6 = local_1a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar5) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    local_198._vptr_Expression = (_func_int **)&PTR_variables_00110c58;
    if (local_198.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_140._vptr_Expression = (_func_int **)&PTR_variables_00110c58;
    if (local_140.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_140.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_158._vptr_Variable = pp_Var6;
    if (local_158.m_variableExpressionPtr.
        super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.m_variableExpressionPtr.
                 super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_1f8._vptr_Variable = pp_Var6;
    if (local_1f8.m_variableExpressionPtr.
        super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f8.m_variableExpressionPtr.
                 super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return 0;
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_90,local_88);
  std::endl<char,std::char_traits<char>>(poVar9);
LAB_00108e28:
  exit(1);
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((ifThenElse(x > y, x, y)).evaluate() == 3,
            "(" + std::to_string(x.evaluate()) + " > " + std::to_string(y.evaluate()) + ") ? "
            + std::to_string(x.evaluate()) + " : " + std::to_string(y.evaluate()) + " != 3");
    assertOrExit((ifThenElse(x > 4, x, 4)).evaluate() == 4,
            "(" + std::to_string(x.evaluate()) + " > 4) ? "
            + std::to_string(x.evaluate()) + " : 4 != 4");
    return 0;
}